

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout_json.c
# Opt level: O3

void ourWriteOutJSON(writeoutvar *mappings,CURL *curl,per_transfer *per,FILE *stream)

{
  CURLINFO CVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  writeoutvar *pwVar6;
  char *name;
  char *pcVar7;
  bool bVar8;
  char *local_48;
  CURL *local_40;
  per_transfer *local_38;
  
  local_38 = per;
  fputs("{",(FILE *)stream);
  pcVar7 = mappings->name;
  if (pcVar7 != (char *)0x0) {
    pwVar6 = mappings + 1;
    local_40 = curl;
    do {
      if ((pwVar6[-1].is_ctrl == 1) || (5 < pwVar6[-1].jsontype - JSON_STRING)) goto LAB_0011c85b;
      CVar1 = pwVar6[-1].cinfo;
      switch(pwVar6[-1].jsontype) {
      case JSON_STRING:
        local_48 = (char *)0x0;
        bVar8 = false;
        iVar2 = curl_easy_getinfo(curl,CVar1,&local_48);
        if ((iVar2 == 0) && (local_48 != (char *)0x0)) {
          curl_mfprintf(stream,"\"%s\":\"",pcVar7);
          jsonEscape(stream,local_48);
          curl_mfprintf(stream,"\"");
LAB_0011c773:
          bVar8 = true;
        }
        break;
      case JSON_LONG:
        if (pwVar6[-1].id != VAR_NUM_HEADERS) {
          local_48 = (char *)0x0;
          iVar2 = curl_easy_getinfo(curl,CVar1,&local_48);
          if (iVar2 == 0) {
            curl_mfprintf(stream,"\"%s\":%ld",pcVar7,local_48);
          }
          bVar8 = iVar2 == 0;
          curl = local_40;
          break;
        }
        curl_mfprintf(stream,"\"%s\":%ld",pcVar7,local_38->num_headers);
        goto LAB_0011c84c;
      case JSON_OFFSET:
        local_48 = (char *)0x0;
        bVar8 = false;
        iVar2 = curl_easy_getinfo(curl,CVar1,&local_48);
        if (iVar2 == 0) {
          pcVar5 = "\"%s\":%ld";
          pcVar4 = local_48;
LAB_0011c707:
          curl_mfprintf(stream,pcVar5,pcVar7,pcVar4);
          goto LAB_0011c773;
        }
        break;
      case JSON_TIME:
        local_48 = (char *)0x0;
        bVar8 = false;
        iVar2 = curl_easy_getinfo(curl,CVar1,&local_48);
        if (iVar2 == 0) {
          curl_mfprintf(stream,"\"%s\":%ld.%06ld",pcVar7,(long)local_48 / 1000000,
                        (long)local_48 % 1000000);
          goto LAB_0011c773;
        }
        break;
      case JSON_VERSION:
        local_48 = (char *)0x0;
        bVar8 = false;
        iVar2 = curl_easy_getinfo(curl,CVar1,&local_48);
        if (local_48 < (char *)0x5 && iVar2 == 0) {
          pcVar5 = "\"%s\":\"%s\"";
          pcVar4 = http_version_rel + *(int *)(http_version_rel + (long)local_48 * 4);
          goto LAB_0011c707;
        }
        break;
      case JSON_FILENAME:
        pcVar4 = (local_38->outs).filename;
        if (pcVar4 == (char *)0x0) {
          curl_mfprintf(stream,"\"%s\":null",pcVar7);
          curl = local_40;
        }
        else {
          curl_mfprintf(stream,"\"%s\":\"",pcVar7);
          jsonEscape(stream,pcVar4);
          curl_mfprintf(stream,"\"");
          curl = local_40;
        }
        goto LAB_0011c84c;
      }
      if (bVar8) {
LAB_0011c84c:
        fputs(",",(FILE *)stream);
      }
LAB_0011c85b:
      pcVar7 = pwVar6->name;
      pwVar6 = pwVar6 + 1;
    } while (pcVar7 != (char *)0x0);
  }
  uVar3 = curl_version();
  curl_mfprintf(stream,"\"curl_version\":\"%s\"}",uVar3);
  return;
}

Assistant:

void ourWriteOutJSON(const struct writeoutvar mappings[], CURL *curl,
                     struct per_transfer *per, FILE *stream)
{
  int i;

  fputs("{", stream);
  for(i = 0; mappings[i].name != NULL; i++) {
    const struct writeoutvar *wovar = &mappings[i];
    const char *name = mappings[i].name;
    CURLINFO cinfo = mappings[i].cinfo;
    int ok = 0;

    if(mappings[i].is_ctrl == 1) {
      continue;
    }

    switch(mappings[i].jsontype) {
    case JSON_STRING:
      ok = writeString(stream, curl, name, cinfo);
      break;
    case JSON_LONG:
      ok = writeLong(stream, curl, name, cinfo, per, wovar);
      break;
    case JSON_OFFSET:
      ok = writeOffset(stream, curl, name, cinfo);
      break;
    case JSON_TIME:
      ok = writeTime(stream, curl, name, cinfo);
      break;
    case JSON_FILENAME:
      ok = writeFilename(stream, name, per->outs.filename);
      break;
    case JSON_VERSION:
      ok = writeVersion(stream, curl, name, cinfo);
      break;
    default:
      break;
    }

    if(ok) {
      fputs(",", stream);
    }
  }

  fprintf(stream, "\"curl_version\":\"%s\"}", curl_version());
}